

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void __thiscall cpptempl::data_ptr::operator=(data_ptr *this,string *data)

{
  pointer pcVar1;
  DataValue *__p;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  __p = (DataValue *)operator_new(0x28);
  pcVar1 = (data->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + data->_M_string_length);
  (__p->super_Data)._vptr_Data = (_func_int **)&PTR_empty_0020b738;
  (__p->m_value)._M_dataplus._M_p = (pointer)&(__p->m_value).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__p->m_value,local_48,local_40 + (long)local_48);
  std::__shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>::reset<cpptempl::DataValue>
            (&(this->ptr).super___shared_ptr<cpptempl::Data,_(__gnu_cxx::_Lock_policy)2>,__p);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return;
}

Assistant:

inline void data_ptr::operator = (const std::string& data) {
        ptr.reset(new DataValue(data));
    }